

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O1

char * nhdp_db_link_status_to_string(nhdp_link *lnk)

{
  uint uVar1;
  
  uVar1 = lnk->status + NHDP_LINK_SYMMETRIC;
  if (uVar1 < 4) {
    return &DAT_00154e3c + *(int *)(&DAT_00154e3c + (ulong)uVar1 * 4);
  }
  return "lost";
}

Assistant:

const char *
nhdp_db_link_status_to_string(struct nhdp_link *lnk) {
  switch (lnk->status) {
    case NHDP_LINK_PENDING:
      return _LINK_PENDING;
    case NHDP_LINK_HEARD:
      return _LINK_HEARD;
    case NHDP_LINK_SYMMETRIC:
      return _LINK_SYMMETRIC;
    default:
      return _LINK_LOST;
  }
}